

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionRequestPdu.cpp
# Opt level: O3

bool __thiscall DIS::ActionRequestPdu::operator==(ActionRequestPdu *this,ActionRequestPdu *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  undefined7 extraout_var;
  undefined4 uVar8;
  pointer pFVar9;
  pointer pVVar10;
  ulong uVar11;
  long lVar12;
  undefined1 auVar13 [16];
  
  bVar5 = SimulationManagementFamilyPdu::operator==
                    (&this->super_SimulationManagementFamilyPdu,
                     &rhs->super_SimulationManagementFamilyPdu);
  bVar6 = EntityID::operator==(&this->_originatingID,&rhs->_originatingID);
  bVar7 = EntityID::operator==(&this->_receivingID,&rhs->_receivingID);
  uVar1 = this->_requestID;
  uVar3 = this->_actionID;
  uVar2 = rhs->_requestID;
  uVar4 = rhs->_actionID;
  auVar13._4_4_ = -(uint)(uVar2 == uVar1);
  auVar13._0_4_ = -(uint)(uVar2 == uVar1);
  auVar13._8_4_ = -(uint)(uVar4 == uVar3);
  auVar13._12_4_ = -(uint)(uVar4 == uVar3);
  uVar8 = movmskpd((int)CONCAT71(extraout_var,bVar5),auVar13);
  bVar5 = (bool)((byte)uVar8 >> 1 & (bVar7 && (bVar6 && bVar5)) & (byte)uVar8);
  pFVar9 = (this->_fixedDatums).
           super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_fixedDatums).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
      _M_impl.super__Vector_impl_data._M_finish != pFVar9) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      bVar6 = FixedDatum::operator==
                        ((FixedDatum *)((long)&pFVar9->_vptr_FixedDatum + lVar12),
                         (FixedDatum *)
                         ((long)&((rhs->_fixedDatums).
                                  super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_FixedDatum +
                         lVar12));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar11 = uVar11 + 1;
      pFVar9 = (this->_fixedDatums).
               super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x10;
    } while (uVar11 < (ulong)((long)(this->_fixedDatums).
                                    super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar9 >> 4))
    ;
  }
  pVVar10 = (this->_variableDatums).
            super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->_variableDatums).
      super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar10) {
    lVar12 = 0;
    uVar11 = 0;
    do {
      bVar6 = VariableDatum::operator==
                        ((VariableDatum *)((long)&pVVar10->_vptr_VariableDatum + lVar12),
                         (VariableDatum *)
                         ((long)&((rhs->_variableDatums).
                                  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_vptr_VariableDatum +
                         lVar12));
      bVar5 = (bool)(bVar5 & bVar6);
      uVar11 = uVar11 + 1;
      pVVar10 = (this->_variableDatums).
                super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x30;
    } while (uVar11 < (ulong)(((long)(this->_variableDatums).
                                     super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar10 >> 4
                              ) * -0x5555555555555555));
  }
  return bVar5;
}

Assistant:

bool ActionRequestPdu::operator ==(const ActionRequestPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SimulationManagementFamilyPdu::operator==(rhs);

     if( ! (_originatingID == rhs._originatingID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;
     if( ! (_requestID == rhs._requestID) ) ivarsEqual = false;
     if( ! (_actionID == rhs._actionID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _fixedDatums.size(); idx++)
     {
        if( ! ( _fixedDatums[idx] == rhs._fixedDatums[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _variableDatums.size(); idx++)
     {
        if( ! ( _variableDatums[idx] == rhs._variableDatums[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }